

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O2

int __thiscall primesieve::SievingPrimes::init(SievingPrimes *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  int extraout_EAX;
  long *in_RDX;
  
  lVar1 = *in_RDX;
  anon_unknown.dwarf_13b61c::isqrt<unsigned_long>(*(unsigned_long *)(ctx + 8));
  Erat::init(&this->super_Erat,(EVP_PKEY_CTX *)(lVar1 + 1));
  tinySieve(this);
  return extraout_EAX;
}

Assistant:

void SievingPrimes::init(Erat* erat, PreSieve& preSieve)
{
  Erat::init(preSieve.getMaxPrime() + 1,
             isqrt(erat->getStop()),
             erat->getSieveSize(),
             preSieve);

  tinySieve();
}